

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O3

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::betti_number
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          size_t _betti,size_t _skipped)

{
  int iVar1;
  ulong uVar2;
  value_type_conflict3 local_38;
  
  uVar2 = (ulong)this->current_dimension - (ulong)this->min_dimension;
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->betti,uVar2 + 1,&local_38);
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->skipped,uVar2 + 1,&local_38);
  (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar2] = _betti;
  iVar1 = -(int)_betti;
  if ((uVar2 & 1) == 0) {
    iVar1 = (int)_betti;
  }
  (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar2] = _skipped;
  this->euler_characteristic = this->euler_characteristic + iVar1;
  return;
}

Assistant:

void betti_number(size_t _betti, size_t _skipped) {
		const auto shifted_dimension = current_dimension - min_dimension;
		betti.resize(shifted_dimension + 1, 0);
		skipped.resize(shifted_dimension + 1, 0);
		betti[shifted_dimension] = _betti;
		skipped[shifted_dimension] = _skipped;
		euler_characteristic += (shifted_dimension & 1 ? -1 : 1) * index_t(_betti);
	}